

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O0

void __thiscall
GdlAttrValueSpec::AdjustToIOIndices
          (GdlAttrValueSpec *this,GdlRuleItem *prit,vector<int,_std::allocator<int>_> *viritInput,
          vector<int,_std::allocator<int>_> *viritOutput)

{
  bool bVar1;
  ExpressionType EVar2;
  undefined8 in_RCX;
  GrcSymbolTableEntry *in_RDX;
  GrcSymbolTableEntry *in_RSI;
  long in_RDI;
  
  EVar2 = GrcSymbolTableEntry::ExpType(*(GrcSymbolTableEntry **)(in_RDI + 0x28));
  if (EVar2 == kexptSlotRef) {
    bVar1 = GrcSymbolTableEntry::IsComponentRef(in_RSI);
    if (bVar1) {
      (**(code **)(**(long **)(in_RDI + 0x38) + 0xb8))(*(long **)(in_RDI + 0x38),in_RDX,0);
    }
    else {
      bVar1 = GrcSymbolTableEntry::IsAttachment(in_RDX);
      if (bVar1) {
        (**(code **)(**(long **)(in_RDI + 0x38) + 0xb8))(*(long **)(in_RDI + 0x38),in_RCX,in_RSI);
      }
    }
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x38) + 0xb8))(*(long **)(in_RDI + 0x38),in_RDX,0);
  }
  return;
}

Assistant:

void GdlAttrValueSpec::AdjustToIOIndices(GdlRuleItem * prit,
	std::vector<int> & viritInput, std::vector<int> & viritOutput)
{
	Assert(m_psymName->FitsSymbolType(ksymtSlotAttr) || m_psymName->FitsSymbolType(ksymtFeature));

	if (m_psymName->ExpType() == kexptSlotRef)
	{
		if (m_psymName->IsComponentRef())
			m_pexpValue->AdjustToIOIndices(viritInput, NULL);
		else if (m_psymName->IsAttachment())
		{
			Assert(m_psymName->LastFieldIs("to"));	// must be attach.to
			m_pexpValue->AdjustToIOIndices(viritOutput, prit);
		}
		else
		{
			Assert(false);
		}
	}
	else
		m_pexpValue->AdjustToIOIndices(viritInput, NULL);
}